

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseJacocoCoverage.cxx
# Opt level: O0

bool __thiscall
cmParseJacocoCoverage::LoadCoverageData
          (cmParseJacocoCoverage *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  cmCTest *this_00;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *poVar4;
  char *pcVar5;
  string local_220;
  string local_200 [32];
  undefined1 local_1e0 [8];
  ostringstream cmCTestLog_msg;
  size_t numf;
  string path;
  size_t i;
  Directory dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  cmParseJacocoCoverage *this_local;
  
  dir.Internal = (DirectoryInternals *)files;
  cmsys::Directory::Directory((Directory *)&i);
  std::__cxx11::string::string((string *)&numf);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&(dir.Internal)->Files);
  path.field_2._8_8_ = 0;
  do {
    if (sVar2 <= (ulong)path.field_2._8_8_) {
      this_local._7_1_ = true;
LAB_001b0f8d:
      std::__cxx11::string::~string((string *)&numf);
      cmsys::Directory::~Directory((Directory *)&i);
      return this_local._7_1_;
    }
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&(dir.Internal)->Files,path.field_2._8_8_);
    std::__cxx11::string::operator=((string *)&numf,(string *)pvVar3);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
    poVar4 = std::operator<<((ostream *)local_1e0,"Reading XML File ");
    poVar4 = std::operator<<(poVar4,(string *)&numf);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_00 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(this_00,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParseJacocoCoverage.cxx"
                 ,0xa3,pcVar5,(bool)(this->Coverage->Quiet & 1));
    std::__cxx11::string::~string(local_200);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
    cmsys::SystemTools::GetFilenameLastExtension(&local_220,(string *)&numf);
    bVar1 = std::operator==(&local_220,".xml");
    std::__cxx11::string::~string((string *)&local_220);
    if (bVar1) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      bVar1 = ReadJacocoXML(this,pcVar5);
      if (!bVar1) {
        this_local._7_1_ = false;
        goto LAB_001b0f8d;
      }
    }
    path.field_2._8_8_ = path.field_2._8_8_ + 1;
  } while( true );
}

Assistant:

bool cmParseJacocoCoverage::LoadCoverageData(
  std::vector<std::string> const& files)
{
  // load all the jacoco.xml files in the source directory
  cmsys::Directory dir;
  size_t i;
  std::string path;
  size_t numf = files.size();
  for (i = 0; i < numf; i++) {
    path = files[i];

    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Reading XML File " << path << std::endl,
                       this->Coverage.Quiet);
    if (cmSystemTools::GetFilenameLastExtension(path) == ".xml") {
      if (!this->ReadJacocoXML(path.c_str())) {
        return false;
      }
    }
  }
  return true;
}